

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::get_struct_type
          (Impl *this,Vector<spv::Id> *type_ids,TypeLayoutFlags flags,char *name)

{
  Vector<StructTypeEntry> *this_00;
  StructTypeEntry *pSVar1;
  size_type __len1;
  Impl *this_01;
  bool bVar2;
  Id IVar3;
  size_t __len2;
  Builder *pBVar4;
  long lVar5;
  char *__s;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  __it;
  long lVar6;
  Vector<spv::Id> *__x;
  __normal_iterator<dxil_spv::Converter::Impl::StructTypeEntry_*,_std::vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>_>
  __it_00;
  StructTypeEntry entry;
  TypeLayoutFlags local_ac;
  Vector<spv::Id> *local_a8;
  StructTypeEntry local_a0;
  Impl *local_58;
  char *local_50;
  Vector<Id> local_48;
  
  local_a0.name._M_dataplus._M_p = (pointer)&local_ac;
  local_a0.name._M_string_length = (size_type)&local_50;
  __it_00._M_current =
       (this->cached_struct_types).
       super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->cached_struct_types).
           super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pSVar1 - (long)__it_00._M_current;
  lVar5 = (lVar6 >> 3) * -0x71c71c71c71c71c7 >> 2;
  local_ac = flags;
  local_a8 = type_ids;
  local_a0._0_8_ = type_ids;
  local_58 = this;
  local_50 = name;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                            *)&local_a0,__it_00);
      __it._M_current = __it_00._M_current;
      __x = local_a8;
      if (bVar2) goto LAB_00113323;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                            *)&local_a0,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      __x = local_a8;
      if (bVar2) goto LAB_00113323;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                            *)&local_a0,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      __x = local_a8;
      if (bVar2) goto LAB_00113323;
      bVar2 = __gnu_cxx::__ops::
              _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
              ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                            *)&local_a0,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      __x = local_a8;
      if (bVar2) goto LAB_00113323;
      __it_00._M_current = __it_00._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x120;
    } while (1 < lVar5);
  }
  lVar5 = (lVar6 >> 3) * -0x71c71c71c71c71c7;
  __x = local_a8;
  if (lVar5 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar5 != 2) {
      __it._M_current = pSVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
                  ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                                *)&local_a0,__it_00), __it._M_current = __it_00._M_current,
         __x = local_a8, bVar2)) goto LAB_00113323;
      __it._M_current = __it_00._M_current + 1;
    }
    __x = local_a8;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
            ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                          *)&local_a0,__it);
    if (bVar2) goto LAB_00113323;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::$_0>
          ::operator()((_Iter_pred<dxil_spv::Converter::Impl::get_struct_type(std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&,unsigned_int,char_const*)::__0>
                        *)&local_a0,__it_00);
  __it._M_current = pSVar1;
  if (bVar2) {
    __it._M_current = __it_00._M_current;
  }
LAB_00113323:
  this_01 = local_58;
  if (__it._M_current ==
      (local_58->cached_struct_types).
      super__Vector_base<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &local_58->cached_struct_types;
    local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
    local_a0.name._M_string_length = 0;
    local_a0.name.field_2._M_local_buf[0] = '\0';
    local_a0.subtypes.
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.subtypes.
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.subtypes.
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator=
              (&local_a0.subtypes,__x);
    __len1 = local_a0.name._M_string_length;
    __s = "";
    if (local_50 != (char *)0x0) {
      __s = local_50;
    }
    __len2 = strlen(__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
    ::_M_replace((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                  *)((long)&local_a0 + 8),0,__len1,__s,__len2);
    if ((local_ac & 8) == 0) {
      pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
      IVar3 = spv::Builder::makeStructType(pBVar4,__x,local_a0.name._M_dataplus._M_p);
      local_a0.id = IVar3;
      if ((local_ac & 1) != 0) {
        decorate_physical_offsets(this_01,IVar3,__x);
      }
    }
    else {
      IVar3 = get_struct_type(this_01,__x,local_ac & 0xfffffff1,local_a0.name._M_dataplus._M_p);
      pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(4);
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      *local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start = IVar3;
      local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      IVar3 = spv::Builder::makeStructType(pBVar4,&local_48,local_a0.name._M_dataplus._M_p);
      local_a0.id = IVar3;
      if (local_48.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != (Id *)0x0) {
        free_in_thread(local_48.
                       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_start);
      }
      pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
      spv::Builder::addDecoration(pBVar4,local_a0.id,DecorationBlock,-1);
      pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
      spv::Builder::addMemberDecoration(pBVar4,local_a0.id,0,DecorationOffset,0);
      if ((local_ac & 4) != 0) {
        pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
        spv::Builder::addMemberDecoration(pBVar4,local_a0.id,0,DecorationCoherent,-1);
      }
      if ((local_ac & 2) != 0) {
        pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
        spv::Builder::addMemberDecoration(pBVar4,local_a0.id,0,DecorationNonWritable,-1);
      }
      pBVar4 = SPIRVModule::get_builder(this_01->spirv_module);
      spv::Builder::addMemberName(pBVar4,local_a0.id,0,"data");
    }
    local_a0.flags = local_ac;
    IVar3 = local_a0.id;
    std::
    vector<dxil_spv::Converter::Impl::StructTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::StructTypeEntry>_>
    ::emplace_back<dxil_spv::Converter::Impl::StructTypeEntry>(this_00,&local_a0);
    if (local_a0.subtypes.
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_a0.subtypes.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
      free_in_thread(local_a0.name._M_dataplus._M_p);
    }
  }
  else {
    IVar3 = (__it._M_current)->id;
  }
  return IVar3;
}

Assistant:

spv::Id Converter::Impl::get_struct_type(const Vector<spv::Id> &type_ids, TypeLayoutFlags flags, const char *name)
{
	auto itr = std::find_if(cached_struct_types.begin(), cached_struct_types.end(), [&](const StructTypeEntry &entry) -> bool {
		if (type_ids.size() != entry.subtypes.size())
			return false;
		if (flags != entry.flags)
			return false;
		if ((!name && !entry.name.empty()) || (entry.name != name))
			return false;

		for (unsigned i = 0; i < type_ids.size(); i++)
			if (type_ids[i] != entry.subtypes[i])
				return false;

		return true;
	});

	if (itr == cached_struct_types.end())
	{
		StructTypeEntry entry;
		entry.subtypes = type_ids;
		entry.name = name ? name : "";

		if ((flags & TYPE_LAYOUT_BLOCK_BIT) != 0)
		{
			constexpr TypeLayoutFlags block_flags = TYPE_LAYOUT_BLOCK_BIT |
			                                        TYPE_LAYOUT_COHERENT_BIT |
			                                        TYPE_LAYOUT_READ_ONLY_BIT;
			spv::Id struct_type_id = get_struct_type(type_ids, flags & ~block_flags, entry.name.c_str());
			entry.id = builder().makeStructType({ struct_type_id }, entry.name.c_str());
			builder().addDecoration(entry.id, spv::DecorationBlock);
			builder().addMemberDecoration(entry.id, 0, spv::DecorationOffset, 0);
			if ((flags & TYPE_LAYOUT_COHERENT_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationCoherent);
			if ((flags & TYPE_LAYOUT_READ_ONLY_BIT) != 0)
				builder().addMemberDecoration(entry.id, 0, spv::DecorationNonWritable);
			builder().addMemberName(entry.id, 0, "data");
		}
		else
		{
			entry.id = builder().makeStructType(type_ids, entry.name.c_str());
			if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
				decorate_physical_offsets(entry.id, type_ids);
		}

		entry.flags = flags;
		spv::Id id = entry.id;
		cached_struct_types.push_back(std::move(entry));
		return id;
	}
	else
		return itr->id;
}